

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

bool __thiscall wabt::WastParser::ParseElemExprOpt(WastParser *this,ElemExpr *out_elem_expr)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Result RVar4;
  Var *this_00;
  Location loc;
  Type type;
  ElemExpr local_d8;
  Var local_78;
  
  GetLocation(&loc,this);
  bVar1 = MatchLpar(this,Item);
  bVar2 = Match(this,Lpar);
  bVar3 = Match(this,RefNull);
  if (bVar3) {
    if (((this->options_->features).bulk_memory_enabled_ == false) &&
       ((this->options_->features).reference_types_enabled_ == false)) {
      Error(this,0x1aeaf3);
    }
    RVar4 = ParseRefKind(this,&type);
    if (RVar4.enum_ == Error) {
      return true;
    }
    ElemExpr::ElemExpr(&local_d8,type);
    ElemExpr::operator=(out_elem_expr,&local_d8);
    this_00 = &local_d8.var;
  }
  else {
    bVar3 = Match(this,RefFunc);
    if (!bVar3) {
      return false;
    }
    local_d8.var.loc.filename.size_._0_4_ = 0;
    local_d8.var.loc._12_8_ = 0;
    local_d8.kind = RefNull;
    local_d8._4_4_ = 0;
    local_d8.var.loc.filename.data_._0_4_ = 0;
    local_d8.var.loc.filename.data_._4_4_ = 0;
    Var::Var((Var *)&type,0xffffffff,(Location *)&local_d8);
    RVar4 = ParseVar(this,(Var *)&type);
    if (RVar4.enum_ == Error) {
      Var::~Var((Var *)&type);
      return true;
    }
    Var::Var(&local_78,(Var *)&type);
    ElemExpr::ElemExpr(&local_d8,&local_78);
    ElemExpr::operator=(out_elem_expr,&local_d8);
    Var::~Var(&local_d8.var);
    Var::~Var(&local_78);
    this_00 = (Var *)&type;
  }
  Var::~Var(this_00);
  if (bVar2) {
    RVar4 = Expect(this,Rpar);
    if (!bVar1 || RVar4.enum_ == Error) {
      return true;
    }
  }
  else if (!bVar1) {
    return true;
  }
  Expect(this,Rpar);
  return true;
}

Assistant:

bool WastParser::ParseElemExprOpt(ElemExpr* out_elem_expr) {
  Location loc = GetLocation();
  bool item = MatchLpar(TokenType::Item);
  bool lpar = Match(TokenType::Lpar);
  if (Match(TokenType::RefNull)) {
    if (!(options_->features.bulk_memory_enabled() ||
          options_->features.reference_types_enabled())) {
      Error(loc, "ref.null not allowed");
    }
    Type type;
    CHECK_RESULT(ParseRefKind(&type));
    *out_elem_expr = ElemExpr(type);
  } else if (Match(TokenType::RefFunc)) {
    Var var;
    CHECK_RESULT(ParseVar(&var));
    *out_elem_expr = ElemExpr(var);
  } else {
    return false;
  }
  if (lpar) {
    EXPECT(Rpar);
  }
  if (item) {
    EXPECT(Rpar);
  }
  return true;
}